

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_op_t *
MIR_new_alias_mem_op
          (MIR_op_t *__return_storage_ptr__,MIR_context_t ctx,MIR_type_t type,MIR_disp_t disp,
          MIR_reg_t base,MIR_reg_t index,MIR_scale_t scale,MIR_alias_t alias,MIR_alias_t nonalias)

{
  __return_storage_ptr__->field_0x8 = 10;
  __return_storage_ptr__->data = (void *)0x0;
  *(char *)&__return_storage_ptr__->u = (char)type;
  (__return_storage_ptr__->u).mem.disp = disp;
  (__return_storage_ptr__->u).mem.base = base;
  (__return_storage_ptr__->u).mem.index = index;
  (__return_storage_ptr__->u).mem.scale = scale;
  (__return_storage_ptr__->u).mem.nloc = 0;
  (__return_storage_ptr__->u).mem.alias = alias;
  (__return_storage_ptr__->u).mem.nonalias = nonalias;
  return __return_storage_ptr__;
}

Assistant:

MIR_op_t MIR_new_alias_mem_op (MIR_context_t ctx, MIR_type_t type, MIR_disp_t disp, MIR_reg_t base,
                               MIR_reg_t index, MIR_scale_t scale, MIR_alias_t alias,
                               MIR_alias_t nonalias) {
  return new_mem_op (ctx, type, disp, base, index, scale, alias, nonalias);
}